

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdpu382_com.c
# Opt level: O3

RK_U32 vdpu382_get_colmv_size
                 (RK_U32 width,RK_U32 height,RK_U32 ctu_size,RK_U32 colmv_bytes,RK_U32 colmv_size,
                 RK_U32 compress)

{
  ulong uVar1;
  int iVar2;
  
  if (compress == 0) {
    iVar2 = ((width + 0x3f & 0xffffffc0) / colmv_size) * colmv_bytes *
            ((height + 0x3f & 0xffffffc0) / colmv_size);
  }
  else {
    uVar1 = (ulong)(colmv_size * colmv_size * 0x40) / (ulong)ctu_size;
    iVar2 = (int)uVar1;
    iVar2 = (int)((-iVar2 & (width + iVar2) - 1) / uVar1);
    iVar2 = (colmv_bytes * iVar2 * 0x40 + (iVar2 + 0xfU & 0xfffffff0)) *
            ((-ctu_size & (height + ctu_size) - 1) / ctu_size);
  }
  return iVar2 + 0x7fU & 0xffffff80;
}

Assistant:

RK_U32 vdpu382_get_colmv_size(RK_U32 width, RK_U32 height, RK_U32 ctu_size,
                              RK_U32 colmv_bytes, RK_U32 colmv_size, RK_U32 compress)
{
    RK_U32 colmv_total_size;

    if (compress) {
        RK_U32 segment_w = (64 * colmv_size * colmv_size) / ctu_size;
        RK_U32 segment_h = ctu_size;
        RK_U32 seg_cnt_w = MPP_ALIGN(width, segment_w) / segment_w;
        RK_U32 seg_cnt_h = MPP_ALIGN(height, segment_h) / segment_h;
        RK_U32 seg_head_size = MPP_ALIGN(seg_cnt_w, 16) * seg_cnt_h;
        RK_U32 seg_payload_size = seg_cnt_w * seg_cnt_h * 64 * colmv_bytes;

        colmv_total_size = seg_head_size + seg_payload_size;
    } else {
        RK_U32 colmv_block_size_w = MPP_ALIGN(width, 64) / colmv_size;
        RK_U32 colmv_block_size_h = MPP_ALIGN(height, 64) / colmv_size;

        colmv_total_size = colmv_block_size_w * colmv_block_size_h * colmv_bytes;
    }

    return MPP_ALIGN(colmv_total_size, 128);
}